

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

ReservedChars __thiscall wabt::WastLexer::ReadReservedChars(WastLexer *this)

{
  ReservedChars RVar1;
  byte *pbVar2;
  byte *pbVar3;
  Token local_60;
  
  pbVar2 = (byte *)this->buffer_end_;
  pbVar3 = (byte *)this->cursor_;
  RVar1 = None;
  if (pbVar3 < pbVar2) {
    RVar1 = None;
    do {
      if ((""[(ulong)*pbVar3 + 1] & 1U) == 0) {
        if (*pbVar3 != 0x22) {
          return RVar1;
        }
        GetStringToken(&local_60,this);
        pbVar2 = (byte *)this->buffer_end_;
        pbVar3 = (byte *)this->cursor_;
        RVar1 = Some;
      }
      else {
        pbVar3 = pbVar3 + 1;
        this->cursor_ = (char *)pbVar3;
        if (RVar1 == None) {
          RVar1 = Id;
        }
      }
    } while (pbVar3 < pbVar2);
  }
  return RVar1;
}

Assistant:

int WastLexer::PeekChar() {
  return cursor_ < buffer_end_ ? static_cast<uint8_t>(*cursor_) : kEof;
}